

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_icc.c
# Opt level: O0

int jas_icccurv_copy(jas_iccattrval_t *attrval,jas_iccattrval_t *othattrval)

{
  jas_iccattrval_t *othattrval_local;
  jas_iccattrval_t *attrval_local;
  
  abort();
}

Assistant:

static int jas_icccurv_copy(jas_iccattrval_t *attrval,
  jas_iccattrval_t *othattrval)
{
	/* Avoid compiler warnings about unused parameters. */
	(void)attrval;
	(void)othattrval;

	/* Not yet implemented. */
	abort();
	return -1;
}